

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav_ins.c
# Opt level: O2

void fsnav_ins_attitude_madgwick(void)

{
  double dVar1;
  char cVar2;
  fsnav_imu *pfVar3;
  bool bVar4;
  double dVar5;
  char *__nptr;
  ulong uVar6;
  long lVar7;
  double *pdVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double a [3];
  char madgwick_token [23];
  double vector1_4 [4];
  double local_e8 [4];
  double local_c8 [4];
  double local_a8 [4];
  double local_88;
  double adStack_80 [3];
  double a_madgwick [3];
  double vector2_4 [4];
  
  dVar9 = fsnav_ins_attitude_madgwick::t0;
  builtin_strncpy(madgwick_token,"madgwick_feedback_rate",0x17);
  if (fsnav->mode == 0) {
    pfVar3 = fsnav->imu;
    if (pfVar3 != (fsnav_imu *)0x0) {
      (pfVar3->sol).L_valid = '\0';
      (pfVar3->sol).rpy_valid = '\0';
      pdVar8 = (pfVar3->sol).L;
      fsnav_ins_attitude_madgwick::L = pdVar8;
      (pfVar3->sol).q[0] = 1.0;
      for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
        (pfVar3->sol).q[lVar7 + 1] = 0.0;
      }
      (pfVar3->sol).q_valid = '\x01';
      fsnav_linal_quat2mat(pdVar8,(pfVar3->sol).q);
      pfVar3 = fsnav->imu;
      (pfVar3->sol).L_valid = '\x01';
      fsnav_linal_mat2rpy((pfVar3->sol).rpy,fsnav_ins_attitude_madgwick::L);
      pfVar3 = fsnav->imu;
      (pfVar3->sol).rpy_valid = '\x01';
      fsnav_ins_attitude_madgwick::t0 = -1.0;
      __nptr = fsnav_locate_token(madgwick_token,pfVar3->cfg,pfVar3->cfglength,'=');
      if (__nptr != (char *)0x0) {
        dVar9 = atof(__nptr);
        fsnav_ins_attitude_madgwick::feedback_rate = dVar9 / (fsnav->imu_const).rad2deg;
      }
    }
  }
  else if ((((-1 < fsnav->mode) && (pfVar3 = fsnav->imu, (pfVar3->sol).L_valid != '\0')) &&
           (pfVar3->w_valid != '\0')) && (pfVar3->f_valid != '\0')) {
    dVar1 = pfVar3->t;
    bVar4 = 0.0 <= fsnav_ins_attitude_madgwick::t0;
    fsnav_ins_attitude_madgwick::t0 = dVar1;
    if (bVar4) {
      for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
        adStack_80[lVar7] = pfVar3->w[lVar7];
      }
      local_88 = 0.0;
      for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
        a_madgwick[lVar7] = pfVar3->f[lVar7];
      }
      dVar10 = fsnav_linal_vnorm(a_madgwick,3);
      pfVar3 = fsnav->imu;
      dVar13 = (pfVar3->sol).q[2];
      dVar11 = (pfVar3->sol).q[3];
      local_e8[0] = dVar11 * 0.0 + dVar13 * -2.0;
      local_e8[1] = dVar13 * 0.0 + dVar11 * 2.0;
      dVar12 = (pfVar3->sol).q[0];
      dVar5 = (pfVar3->sol).q[1];
      dVar14 = 0.5 - dVar5 * dVar5;
      dVar16 = dVar5 * dVar11 - dVar12 * dVar13;
      dVar17 = dVar12 * dVar5 + dVar13 * dVar11;
      dVar15 = dVar14 + -dVar13 * dVar13;
      local_e8[2] = dVar12 * -2.0 + dVar13 * -0.0 + dVar5 * 0.0;
      local_e8[3] = dVar5 * 2.0 + dVar11 * -0.0 + dVar12 * 0.0;
      local_c8[2] = dVar5 * 0.0 + dVar11 * 2.0;
      local_c8[3] = dVar13 * 2.0 + dVar11 * -0.0 + dVar12 * -0.0;
      local_a8[0] = dVar13 * 0.0 + dVar5 * -0.0;
      local_c8[0] = dVar11 * -0.0 + dVar5 + dVar5;
      local_c8[1] = dVar12 * 2.0 + local_a8[0];
      local_a8[1] = dVar5 * -4.0 + dVar12 * -0.0 + dVar11 * 0.0;
      local_a8[2] = dVar13 * -4.0 + dVar12 * 0.0 + dVar11 * 0.0;
      local_a8[3] = dVar5 * 0.0 + dVar13 * 0.0;
      for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
        vector1_4[lVar7] =
             local_a8[lVar7] *
             ((dVar15 + dVar15 +
              (dVar12 * dVar13 + dVar5 * dVar11) * 0.0 + (dVar13 * dVar11 - dVar12 * dVar5) * 0.0) -
             a_madgwick[2] / dVar10) +
             local_e8[lVar7] *
             ((dVar16 + dVar16 +
              (-dVar13 * dVar13 + 0.5 + -dVar11 * dVar11) * 0.0 +
              (dVar12 * dVar11 + dVar13 * dVar5) * 0.0) - a_madgwick[0] / dVar10) +
             local_c8[lVar7] *
             ((dVar17 + dVar17 +
              (dVar13 * dVar5 - dVar12 * dVar11) * 0.0 + (-dVar11 * dVar11 + dVar14) * 0.0) -
             a_madgwick[1] / dVar10);
      }
      fsnav_linal_qmul(vector2_4,(pfVar3->sol).q,&local_88);
      for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
        dVar13 = vector2_4[lVar7];
        dVar11 = fsnav_ins_attitude_madgwick::feedback_rate * vector1_4[lVar7];
        dVar12 = fsnav_linal_vnorm(vector1_4,4);
        (fsnav->imu->sol).q[lVar7] =
             (dVar13 - dVar11 / (dVar12 + 9.5367431640625e-07)) * 0.5 * (dVar1 - dVar9) +
             (fsnav->imu->sol).q[lVar7];
      }
      dVar13 = fsnav_linal_vnorm((fsnav->imu->sol).q,4);
      pdVar8 = (fsnav->imu->sol).q;
      for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
        pdVar8[lVar7] = pdVar8[lVar7] / dVar13;
      }
      fsnav_linal_quat2mat(fsnav_ins_attitude_madgwick::L,pdVar8);
      pfVar3 = fsnav->imu;
      cVar2 = pfVar3->W_valid;
      for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
        if (cVar2 == '\0') {
          dVar13 = 0.0;
        }
        else {
          dVar13 = pfVar3->W[lVar7];
        }
        a[lVar7] = dVar13;
      }
      if ((pfVar3->sol).llh_valid != '\0') {
        dVar13 = (fsnav->imu_const).u;
        dVar11 = cos((pfVar3->sol).llh[1]);
        a[1] = dVar11 * dVar13 + a[1];
        dVar13 = (fsnav->imu_const).u;
        dVar11 = sin((fsnav->imu->sol).llh[1]);
        a[2] = dVar11 * dVar13 + a[2];
      }
      for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
        a[lVar7] = a[lVar7] * (dVar1 - dVar9);
      }
      fsnav_linal_eul2mat(fsnav_ins_attitude_madgwick::C,a);
      pdVar8 = fsnav_ins_attitude_madgwick::L;
      for (uVar6 = 0; uVar6 < 9; uVar6 = uVar6 + 3) {
        a[0] = pdVar8[uVar6];
        a[1] = pdVar8[uVar6 + 1];
        a[2] = pdVar8[uVar6 + 2];
        pdVar8[uVar6] =
             a[2] * fsnav_ins_attitude_madgwick::C[2] +
             a[0] * fsnav_ins_attitude_madgwick::C[0] + a[1] * fsnav_ins_attitude_madgwick::C[1];
        pdVar8[uVar6 + 1] =
             a[2] * fsnav_ins_attitude_madgwick::C[5] +
             a[0] * fsnav_ins_attitude_madgwick::C[3] + a[1] * fsnav_ins_attitude_madgwick::C[4];
        pdVar8[uVar6 + 2] =
             a[2] * fsnav_ins_attitude_madgwick::C[8] +
             a[0] * fsnav_ins_attitude_madgwick::C[6] + a[1] * fsnav_ins_attitude_madgwick::C[7];
      }
      fsnav_linal_mat2quat((fsnav->imu->sol).q,pdVar8);
      pfVar3 = fsnav->imu;
      (pfVar3->sol).q_valid = '\x01';
      fsnav_linal_mat2rpy((pfVar3->sol).rpy,fsnav_ins_attitude_madgwick::L);
      (fsnav->imu->sol).rpy_valid = '\x01';
    }
  }
  return;
}

Assistant:

void fsnav_ins_attitude_madgwick(void) {

	static double t0 = -1;  // начальное время
	static double
		C[9],               // переходная матрица
		*L;                 // указатель на матрицу ориентации навигационного решения

	char *cfg_ptr;                      // указатель на параметр в строке конфигурации
	const char madgwick_token[] = "madgwick_feedback_rate";
	static double feedback_rate = -1;   // настраиваемый параметр, рад/сек, ~sqrt(3)*(остаточный дрейф гироскопов)
	const double epsilon = 1.0/1048576; // 2^-20 ~ 1e-6 

	double
		a[3],
		s,
		dt,                         // шаг времени
		w_madgwick[4],              // угловая скорость
		a_madgwick[3],              // измерения акселерометров
		J_madgwick[3][4],           // якобиан
		f_madgwick[3],              // целевая функция
		vector1_4[4],               // grad(f)
		vector2_4[4];               // 2*dq/dt
	size_t i;                       // индекс

	// инициализация
	if (fsnav->mode == 0) {

		// проверка инерциальной подсистемы на шине
		if (fsnav->imu == NULL)
			return;
		// сброс флагов достоверности
		fsnav->imu->sol.q_valid = 0;
		fsnav->imu->sol.L_valid = 0;
		fsnav->imu->sol.rpy_valid = 0;
		// указатель на матрицу ориентации imu->sol
		L = fsnav->imu->sol.L;
		// единичный кватернион
		for (i = 1, fsnav->imu->sol.q[0] = 1; i < 4; i++)
			fsnav->imu->sol.q[i] = 0;
		fsnav->imu->sol.q_valid = 1;
		// матрица ориентации
		fsnav_linal_quat2mat(L, fsnav->imu->sol.q);
		fsnav->imu->sol.L_valid = 1;
		// углы ориентации, соответствующие матрице ориентации
		fsnav_linal_mat2rpy(fsnav->imu->sol.rpy, L);
		fsnav->imu->sol.rpy_valid = 1;
		// обнуление начального времени
		t0 = -1;

		cfg_ptr = fsnav_locate_token(madgwick_token, fsnav->imu->cfg, fsnav->imu->cfglength, '=');
		if (cfg_ptr != NULL)
			feedback_rate = atof(cfg_ptr)/fsnav->imu_const.rad2deg;
		else
			return;

	}

	// завершение работы
	else if (fsnav->mode < 0) {}
	
	// операции на каждом шаге
	else {
		// проверка достоверности необходимых данных
		if (!fsnav->imu->sol.L_valid || !fsnav->imu->w_valid || !fsnav->imu->f_valid)
			return;
		// временнЫе переменные
		if (t0 < 0) {
			t0 = fsnav->imu->t;
			return;
		}
		dt = fsnav->imu->t - t0;
		t0 = fsnav->imu->t;

		for (i = 0, w_madgwick[0] = 0; i < 3; i++)
			w_madgwick[i+1] = fsnav->imu->w[i];

		for (i = 0, w_madgwick[0] = 0; i < 3; i++)
			a_madgwick[i] = fsnav->imu->f[i];

		double g0 = 0;
		double g1 = 0;
		double g2 = 1.0;
		// формирование целевой функции
		s = fsnav_linal_vnorm(a_madgwick, 3);
		f_madgwick[0] = 2.0*g0*(0.5 - fsnav->imu->sol.q[2]*fsnav->imu->sol.q[2] - fsnav->imu->sol.q[3]*fsnav->imu->sol.q[3])
		              + 2.0*g1*(      fsnav->imu->sol.q[0]*fsnav->imu->sol.q[3] + fsnav->imu->sol.q[1]*fsnav->imu->sol.q[2])
		              + 2.0*g2*(      fsnav->imu->sol.q[1]*fsnav->imu->sol.q[3] - fsnav->imu->sol.q[0]*fsnav->imu->sol.q[2]) - a_madgwick[0]/s;
		f_madgwick[1] = 2.0*g0*(      fsnav->imu->sol.q[1]*fsnav->imu->sol.q[2] - fsnav->imu->sol.q[0]*fsnav->imu->sol.q[3])
		              + 2.0*g1*(0.5 - fsnav->imu->sol.q[1]*fsnav->imu->sol.q[1] - fsnav->imu->sol.q[3]*fsnav->imu->sol.q[3])
		              + 2.0*g2*(      fsnav->imu->sol.q[0]*fsnav->imu->sol.q[1] + fsnav->imu->sol.q[2]*fsnav->imu->sol.q[3]) - a_madgwick[1]/s;
		f_madgwick[2] = 2.0*g0*(      fsnav->imu->sol.q[0]*fsnav->imu->sol.q[2] + fsnav->imu->sol.q[1]*fsnav->imu->sol.q[3])
		              + 2.0*g1*(      fsnav->imu->sol.q[2]*fsnav->imu->sol.q[3] - fsnav->imu->sol.q[0]*fsnav->imu->sol.q[1])
		              + 2.0*g2*(0.5 - fsnav->imu->sol.q[1]*fsnav->imu->sol.q[1] - fsnav->imu->sol.q[2]*fsnav->imu->sol.q[2]) - a_madgwick[2]/s;
		// формирование якобиана
		J_madgwick[0][0] =  2.0*g1*fsnav->imu->sol.q[3] - 2.0*g2*fsnav->imu->sol.q[2]; 
		J_madgwick[0][1] =  2.0*g1*fsnav->imu->sol.q[2] + 2.0*g2*fsnav->imu->sol.q[3]; 
		J_madgwick[0][2] = -4.0*g0*fsnav->imu->sol.q[2] + 2.0*g1*fsnav->imu->sol.q[1] - 2.0*g2*fsnav->imu->sol.q[0]; 
		J_madgwick[0][3] = -4.0*g0*fsnav->imu->sol.q[3] + 2.0*g1*fsnav->imu->sol.q[0] + 2.0*g2*fsnav->imu->sol.q[1];
		J_madgwick[1][0] = -2.0*g0*fsnav->imu->sol.q[3] + 2.0*g2*fsnav->imu->sol.q[1];
		J_madgwick[1][1] =  2.0*g0*fsnav->imu->sol.q[2] - 4.0*g1*fsnav->imu->sol.q[1] + 2.0*g2*fsnav->imu->sol.q[0];
		J_madgwick[1][2] =  2.0*g0*fsnav->imu->sol.q[1] + 2.0*g2*fsnav->imu->sol.q[3];
		J_madgwick[1][3] = -2.0*g0*fsnav->imu->sol.q[0] - 4.0*g1*fsnav->imu->sol.q[3] + 2.0*g2*fsnav->imu->sol.q[2];
		J_madgwick[2][0] =  2.0*g0*fsnav->imu->sol.q[2] - 2.0*g1*fsnav->imu->sol.q[1];
		J_madgwick[2][1] =  2.0*g0*fsnav->imu->sol.q[3] - 2.0*g1*fsnav->imu->sol.q[0] - 4.0*g2*fsnav->imu->sol.q[1];
		J_madgwick[2][2] =  2.0*g0*fsnav->imu->sol.q[0] + 2.0*g1*fsnav->imu->sol.q[3] - 4.0*g2*fsnav->imu->sol.q[2];
		J_madgwick[2][3] =  2.0*g0*fsnav->imu->sol.q[1] + 2.0*g1*fsnav->imu->sol.q[2];
		
		for (i = 0; i < 4; i++)
			vector1_4[i] = J_madgwick[0][i]*f_madgwick[0] + J_madgwick[1][i]*f_madgwick[1] + J_madgwick[2][i]*f_madgwick[2];

		fsnav_linal_qmul(vector2_4, fsnav->imu->sol.q, w_madgwick);
		// интегрирование
		for (i = 0; i < 4; i++) // для избежания деления на ноль
			fsnav->imu->sol.q[i] += 0.5*(vector2_4[i] - feedback_rate*vector1_4[i]/(epsilon + fsnav_linal_vnorm(vector1_4,4)))*dt;

		// норма
		s = fsnav_linal_vnorm(fsnav->imu->sol.q, 4);
		for (i = 0; i < 4; i++)
			fsnav->imu->sol.q[i] /= s;

		// L = L(q)
		fsnav_linal_quat2mat(L, fsnav->imu->sol.q);

		// опорный трёхгранник
		// a <- c = (W + u)*dt
		for (i = 0; i < 3; i++)
			a[i] = fsnav->imu->W_valid ? fsnav->imu->W[i] : 0;
		if (fsnav->imu->sol.llh_valid) {
			a[1] += fsnav->imu_const.u*cos(fsnav->imu->sol.llh[1]);
			a[2] += fsnav->imu_const.u*sin(fsnav->imu->sol.llh[1]);
		}
		for (i = 0; i < 3; i++)
			a[i] *= dt;
		// L = L*(E + [c x]*sin(c)/|c| + [c x]^2*(1-cos(c))/|c|^2)^T
		fsnav_linal_eul2mat(C, a);	// C = E + [c x]*sin(c)/|c| + [c x]^2*(1-cos(c))/|c|^2
		for (i = 0; i < 9; i += 3) { // L = L*C^T
			a[0] = L[i+0];
			a[1] = L[i+1]; 
			a[2] = L[i+2];
			L[i+0] = a[0]*C[0] + a[1]*C[1] + a[2]*C[2];
			L[i+1] = a[0]*C[3] + a[1]*C[4] + a[2]*C[5];
			L[i+2] = a[0]*C[6] + a[1]*C[7] + a[2]*C[8];
		}
		// обновление кватерниона ориентации
		fsnav_linal_mat2quat(fsnav->imu->sol.q, L);
		fsnav->imu->sol.q_valid = 1;
		// обновление углов ориентации
		fsnav_linal_mat2rpy(fsnav->imu->sol.rpy, L);
		fsnav->imu->sol.rpy_valid = 1;
	}
}